

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O3

int RqOutCompile(RqOutWorkMem *pOutWorkMem,RqOutProgram *pOutProgMem,size_t nOutProgMemSize)

{
  ulong __n;
  int iVar1;
  
  __n = (long)pOutWorkMem->nESI * 4 + 0x34;
  if (__n < nOutProgMemSize) {
    RqOutCompile_cold_1();
    iVar1 = -1;
  }
  else {
    memcpy(pOutProgMem,pOutWorkMem,__n);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RqOutCompile(RqOutWorkMem* pOutWorkMem,
		 RqOutProgram* pOutProgMem,
		 size_t nOutProgMemSize)
{
	size_t sz = sizeof(*pOutProgMem) + pOutWorkMem->nESI * sizeof(pOutProgMem->ESIs[0]);
	if (sz < nOutProgMemSize) {
		errmsg("Not enough memory for OutProgMem.");
		return RQ_ERR_ENOMEM;
	}

	memcpy(pOutProgMem, pOutWorkMem, sz);
	return 0;
}